

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O1

void aom_hadamard_lp_8x8_sse2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  short *psVar4;
  short *psVar5;
  short *psVar6;
  short *psVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  
  psVar1 = src_diff + src_stride;
  psVar2 = psVar1 + src_stride;
  psVar3 = psVar2 + src_stride;
  psVar4 = psVar3 + src_stride;
  psVar5 = psVar4 + src_stride;
  psVar6 = psVar5 + src_stride;
  psVar7 = psVar6 + src_stride;
  sVar56 = *psVar1 + *src_diff;
  sVar57 = psVar1[1] + src_diff[1];
  sVar58 = psVar1[2] + src_diff[2];
  sVar59 = psVar1[3] + src_diff[3];
  sVar60 = psVar1[4] + src_diff[4];
  sVar61 = psVar1[5] + src_diff[5];
  sVar62 = psVar1[6] + src_diff[6];
  sVar63 = psVar1[7] + src_diff[7];
  sVar16 = *src_diff - *psVar1;
  sVar17 = src_diff[1] - psVar1[1];
  sVar18 = src_diff[2] - psVar1[2];
  sVar19 = src_diff[3] - psVar1[3];
  sVar20 = src_diff[4] - psVar1[4];
  sVar21 = src_diff[5] - psVar1[5];
  sVar22 = src_diff[6] - psVar1[6];
  sVar23 = src_diff[7] - psVar1[7];
  sVar84 = *psVar3 + *psVar2;
  sVar86 = psVar3[1] + psVar2[1];
  sVar88 = psVar3[2] + psVar2[2];
  sVar90 = psVar3[3] + psVar2[3];
  sVar92 = psVar3[4] + psVar2[4];
  sVar94 = psVar3[5] + psVar2[5];
  sVar96 = psVar3[6] + psVar2[6];
  sVar98 = psVar3[7] + psVar2[7];
  sVar8 = *psVar2 - *psVar3;
  sVar9 = psVar2[1] - psVar3[1];
  sVar10 = psVar2[2] - psVar3[2];
  sVar11 = psVar2[3] - psVar3[3];
  sVar12 = psVar2[4] - psVar3[4];
  sVar13 = psVar2[5] - psVar3[5];
  sVar14 = psVar2[6] - psVar3[6];
  sVar15 = psVar2[7] - psVar3[7];
  sVar64 = *psVar5 + *psVar4;
  sVar65 = psVar5[1] + psVar4[1];
  sVar66 = psVar5[2] + psVar4[2];
  sVar67 = psVar5[3] + psVar4[3];
  sVar68 = psVar5[4] + psVar4[4];
  sVar69 = psVar5[5] + psVar4[5];
  sVar70 = psVar5[6] + psVar4[6];
  sVar71 = psVar5[7] + psVar4[7];
  sVar48 = *psVar4 - *psVar5;
  sVar49 = psVar4[1] - psVar5[1];
  sVar50 = psVar4[2] - psVar5[2];
  sVar51 = psVar4[3] - psVar5[3];
  sVar52 = psVar4[4] - psVar5[4];
  sVar53 = psVar4[5] - psVar5[5];
  sVar54 = psVar4[6] - psVar5[6];
  sVar55 = psVar4[7] - psVar5[7];
  sVar72 = *psVar7 + *psVar6;
  sVar73 = psVar7[1] + psVar6[1];
  sVar74 = psVar7[2] + psVar6[2];
  sVar75 = psVar7[3] + psVar6[3];
  sVar76 = psVar7[4] + psVar6[4];
  sVar77 = psVar7[5] + psVar6[5];
  sVar78 = psVar7[6] + psVar6[6];
  sVar79 = psVar7[7] + psVar6[7];
  sVar40 = *psVar6 - *psVar7;
  sVar41 = psVar6[1] - psVar7[1];
  sVar42 = psVar6[2] - psVar7[2];
  sVar43 = psVar6[3] - psVar7[3];
  sVar44 = psVar6[4] - psVar7[4];
  sVar45 = psVar6[5] - psVar7[5];
  sVar46 = psVar6[6] - psVar7[6];
  sVar47 = psVar6[7] - psVar7[7];
  sVar24 = sVar84 + sVar56;
  sVar25 = sVar86 + sVar57;
  sVar26 = sVar88 + sVar58;
  sVar27 = sVar90 + sVar59;
  sVar28 = sVar92 + sVar60;
  sVar29 = sVar94 + sVar61;
  sVar30 = sVar96 + sVar62;
  sVar31 = sVar98 + sVar63;
  sVar32 = sVar8 + sVar16;
  sVar33 = sVar9 + sVar17;
  sVar34 = sVar10 + sVar18;
  sVar35 = sVar11 + sVar19;
  sVar36 = sVar12 + sVar20;
  sVar37 = sVar13 + sVar21;
  sVar38 = sVar14 + sVar22;
  sVar39 = sVar15 + sVar23;
  sVar56 = sVar56 - sVar84;
  sVar57 = sVar57 - sVar86;
  sVar58 = sVar58 - sVar88;
  sVar59 = sVar59 - sVar90;
  sVar60 = sVar60 - sVar92;
  sVar61 = sVar61 - sVar94;
  sVar62 = sVar62 - sVar96;
  sVar63 = sVar63 - sVar98;
  sVar16 = sVar16 - sVar8;
  sVar17 = sVar17 - sVar9;
  sVar18 = sVar18 - sVar10;
  sVar19 = sVar19 - sVar11;
  sVar20 = sVar20 - sVar12;
  sVar21 = sVar21 - sVar13;
  sVar22 = sVar22 - sVar14;
  sVar23 = sVar23 - sVar15;
  sVar84 = sVar72 + sVar64;
  sVar86 = sVar73 + sVar65;
  sVar88 = sVar74 + sVar66;
  sVar90 = sVar75 + sVar67;
  sVar92 = sVar76 + sVar68;
  sVar81 = sVar77 + sVar69;
  sVar82 = sVar78 + sVar70;
  sVar83 = sVar79 + sVar71;
  sVar85 = sVar40 + sVar48;
  sVar87 = sVar41 + sVar49;
  sVar89 = sVar42 + sVar50;
  sVar91 = sVar43 + sVar51;
  sVar93 = sVar44 + sVar52;
  sVar95 = sVar45 + sVar53;
  sVar97 = sVar46 + sVar54;
  sVar99 = sVar47 + sVar55;
  sVar64 = sVar64 - sVar72;
  sVar65 = sVar65 - sVar73;
  sVar66 = sVar66 - sVar74;
  sVar67 = sVar67 - sVar75;
  sVar68 = sVar68 - sVar76;
  sVar69 = sVar69 - sVar77;
  sVar70 = sVar70 - sVar78;
  sVar71 = sVar71 - sVar79;
  sVar48 = sVar48 - sVar40;
  sVar49 = sVar49 - sVar41;
  sVar50 = sVar50 - sVar42;
  sVar51 = sVar51 - sVar43;
  sVar52 = sVar52 - sVar44;
  sVar53 = sVar53 - sVar45;
  sVar54 = sVar54 - sVar46;
  sVar55 = sVar55 - sVar47;
  sVar8 = sVar84 + sVar24;
  sVar9 = sVar86 + sVar25;
  sVar11 = sVar88 + sVar26;
  sVar10 = sVar90 + sVar27;
  sVar14 = sVar92 + sVar28;
  sVar12 = sVar81 + sVar29;
  sVar40 = sVar82 + sVar30;
  sVar13 = sVar83 + sVar31;
  sVar43 = sVar85 + sVar32;
  sVar77 = sVar87 + sVar33;
  sVar94 = sVar89 + sVar34;
  sVar78 = sVar91 + sVar35;
  sVar46 = sVar93 + sVar36;
  sVar79 = sVar95 + sVar37;
  sVar98 = sVar97 + sVar38;
  sVar80 = sVar99 + sVar39;
  sVar41 = sVar64 + sVar56;
  sVar100 = sVar65 + sVar57;
  sVar96 = sVar66 + sVar58;
  sVar101 = sVar67 + sVar59;
  sVar44 = sVar68 + sVar60;
  sVar102 = sVar69 + sVar61;
  sVar103 = sVar70 + sVar62;
  sVar104 = sVar71 + sVar63;
  sVar42 = sVar48 + sVar16;
  sVar15 = sVar49 + sVar17;
  sVar72 = sVar50 + sVar18;
  sVar73 = sVar51 + sVar19;
  sVar45 = sVar52 + sVar20;
  sVar74 = sVar53 + sVar21;
  sVar75 = sVar54 + sVar22;
  sVar76 = sVar55 + sVar23;
  sVar24 = sVar24 - sVar84;
  sVar25 = sVar25 - sVar86;
  sVar26 = sVar26 - sVar88;
  sVar27 = sVar27 - sVar90;
  sVar28 = sVar28 - sVar92;
  sVar29 = sVar29 - sVar81;
  sVar30 = sVar30 - sVar82;
  sVar31 = sVar31 - sVar83;
  sVar32 = sVar32 - sVar85;
  sVar33 = sVar33 - sVar87;
  sVar34 = sVar34 - sVar89;
  sVar35 = sVar35 - sVar91;
  sVar36 = sVar36 - sVar93;
  sVar37 = sVar37 - sVar95;
  sVar38 = sVar38 - sVar97;
  sVar39 = sVar39 - sVar99;
  sVar56 = sVar56 - sVar64;
  sVar57 = sVar57 - sVar65;
  sVar58 = sVar58 - sVar66;
  sVar59 = sVar59 - sVar67;
  sVar60 = sVar60 - sVar68;
  sVar61 = sVar61 - sVar69;
  sVar62 = sVar62 - sVar70;
  sVar63 = sVar63 - sVar71;
  sVar16 = sVar16 - sVar48;
  sVar17 = sVar17 - sVar49;
  sVar18 = sVar18 - sVar50;
  sVar19 = sVar19 - sVar51;
  sVar20 = sVar20 - sVar52;
  sVar21 = sVar21 - sVar53;
  sVar22 = sVar22 - sVar54;
  sVar23 = sVar23 - sVar55;
  sVar47 = sVar9 + sVar8;
  sVar48 = sVar57 + sVar56;
  sVar49 = sVar25 + sVar24;
  sVar50 = sVar100 + sVar41;
  sVar51 = sVar15 + sVar42;
  sVar52 = sVar17 + sVar16;
  sVar53 = sVar33 + sVar32;
  sVar54 = sVar77 + sVar43;
  sVar8 = sVar8 - sVar9;
  sVar56 = sVar56 - sVar57;
  sVar24 = sVar24 - sVar25;
  sVar41 = sVar41 - sVar100;
  sVar42 = sVar42 - sVar15;
  sVar16 = sVar16 - sVar17;
  sVar32 = sVar32 - sVar33;
  sVar43 = sVar43 - sVar77;
  sVar64 = sVar10 + sVar11;
  sVar65 = sVar59 + sVar58;
  sVar66 = sVar27 + sVar26;
  sVar67 = sVar101 + sVar96;
  sVar68 = sVar73 + sVar72;
  sVar69 = sVar19 + sVar18;
  sVar70 = sVar35 + sVar34;
  sVar71 = sVar78 + sVar94;
  sVar11 = sVar11 - sVar10;
  sVar58 = sVar58 - sVar59;
  sVar26 = sVar26 - sVar27;
  sVar96 = sVar96 - sVar101;
  sVar72 = sVar72 - sVar73;
  sVar18 = sVar18 - sVar19;
  sVar34 = sVar34 - sVar35;
  sVar94 = sVar94 - sVar78;
  sVar25 = sVar12 + sVar14;
  sVar27 = sVar61 + sVar60;
  sVar33 = sVar29 + sVar28;
  sVar35 = sVar102 + sVar44;
  sVar73 = sVar74 + sVar45;
  sVar55 = sVar21 + sVar20;
  sVar57 = sVar37 + sVar36;
  sVar59 = sVar79 + sVar46;
  sVar14 = sVar14 - sVar12;
  sVar60 = sVar60 - sVar61;
  sVar28 = sVar28 - sVar29;
  sVar44 = sVar44 - sVar102;
  sVar45 = sVar45 - sVar74;
  sVar20 = sVar20 - sVar21;
  sVar36 = sVar36 - sVar37;
  sVar46 = sVar46 - sVar79;
  sVar77 = sVar13 + sVar40;
  sVar78 = sVar63 + sVar62;
  sVar79 = sVar31 + sVar30;
  sVar84 = sVar104 + sVar103;
  sVar86 = sVar76 + sVar75;
  sVar88 = sVar23 + sVar22;
  sVar90 = sVar39 + sVar38;
  sVar92 = sVar80 + sVar98;
  sVar40 = sVar40 - sVar13;
  sVar62 = sVar62 - sVar63;
  sVar30 = sVar30 - sVar31;
  sVar103 = sVar103 - sVar104;
  sVar75 = sVar75 - sVar76;
  sVar22 = sVar22 - sVar23;
  sVar38 = sVar38 - sVar39;
  sVar98 = sVar98 - sVar80;
  sVar23 = sVar64 + sVar47;
  sVar29 = sVar65 + sVar48;
  sVar31 = sVar66 + sVar49;
  sVar37 = sVar67 + sVar50;
  sVar39 = sVar68 + sVar51;
  sVar74 = sVar69 + sVar52;
  sVar76 = sVar70 + sVar53;
  sVar61 = sVar71 + sVar54;
  sVar9 = sVar11 + sVar8;
  sVar10 = sVar58 + sVar56;
  sVar12 = sVar26 + sVar24;
  sVar13 = sVar96 + sVar41;
  sVar15 = sVar72 + sVar42;
  sVar17 = sVar18 + sVar16;
  sVar19 = sVar34 + sVar32;
  sVar21 = sVar94 + sVar43;
  sVar47 = sVar47 - sVar64;
  sVar48 = sVar48 - sVar65;
  sVar49 = sVar49 - sVar66;
  sVar50 = sVar50 - sVar67;
  sVar51 = sVar51 - sVar68;
  sVar52 = sVar52 - sVar69;
  sVar53 = sVar53 - sVar70;
  sVar54 = sVar54 - sVar71;
  sVar8 = sVar8 - sVar11;
  sVar56 = sVar56 - sVar58;
  sVar24 = sVar24 - sVar26;
  sVar41 = sVar41 - sVar96;
  sVar42 = sVar42 - sVar72;
  sVar16 = sVar16 - sVar18;
  sVar32 = sVar32 - sVar34;
  sVar43 = sVar43 - sVar94;
  sVar11 = sVar77 + sVar25;
  sVar18 = sVar78 + sVar27;
  sVar26 = sVar79 + sVar33;
  sVar34 = sVar84 + sVar35;
  sVar72 = sVar86 + sVar73;
  sVar64 = sVar88 + sVar55;
  sVar65 = sVar90 + sVar57;
  sVar58 = sVar92 + sVar59;
  sVar66 = sVar40 + sVar14;
  sVar67 = sVar62 + sVar60;
  sVar68 = sVar30 + sVar28;
  sVar69 = sVar103 + sVar44;
  sVar70 = sVar75 + sVar45;
  sVar63 = sVar22 + sVar20;
  sVar71 = sVar38 + sVar36;
  sVar94 = sVar98 + sVar46;
  sVar25 = sVar25 - sVar77;
  sVar27 = sVar27 - sVar78;
  sVar33 = sVar33 - sVar79;
  sVar35 = sVar35 - sVar84;
  sVar73 = sVar73 - sVar86;
  sVar55 = sVar55 - sVar88;
  sVar57 = sVar57 - sVar90;
  sVar59 = sVar59 - sVar92;
  sVar14 = sVar14 - sVar40;
  sVar60 = sVar60 - sVar62;
  sVar28 = sVar28 - sVar30;
  sVar44 = sVar44 - sVar103;
  sVar45 = sVar45 - sVar75;
  sVar20 = sVar20 - sVar22;
  sVar36 = sVar36 - sVar38;
  sVar46 = sVar46 - sVar98;
  *coeff = sVar11 + sVar23;
  coeff[1] = sVar18 + sVar29;
  coeff[2] = sVar26 + sVar31;
  coeff[3] = sVar34 + sVar37;
  coeff[4] = sVar72 + sVar39;
  coeff[5] = sVar64 + sVar74;
  coeff[6] = sVar65 + sVar76;
  coeff[7] = sVar58 + sVar61;
  coeff[8] = sVar47 - sVar25;
  coeff[9] = sVar48 - sVar27;
  coeff[10] = sVar49 - sVar33;
  coeff[0xb] = sVar50 - sVar35;
  coeff[0xc] = sVar51 - sVar73;
  coeff[0xd] = sVar52 - sVar55;
  coeff[0xe] = sVar53 - sVar57;
  coeff[0xf] = sVar54 - sVar59;
  coeff[0x10] = sVar23 - sVar11;
  coeff[0x11] = sVar29 - sVar18;
  coeff[0x12] = sVar31 - sVar26;
  coeff[0x13] = sVar37 - sVar34;
  coeff[0x14] = sVar39 - sVar72;
  coeff[0x15] = sVar74 - sVar64;
  coeff[0x16] = sVar76 - sVar65;
  coeff[0x17] = sVar61 - sVar58;
  coeff[0x18] = sVar25 + sVar47;
  coeff[0x19] = sVar27 + sVar48;
  coeff[0x1a] = sVar33 + sVar49;
  coeff[0x1b] = sVar35 + sVar50;
  coeff[0x1c] = sVar73 + sVar51;
  coeff[0x1d] = sVar55 + sVar52;
  coeff[0x1e] = sVar57 + sVar53;
  coeff[0x1f] = sVar59 + sVar54;
  coeff[0x20] = sVar14 + sVar8;
  coeff[0x21] = sVar60 + sVar56;
  coeff[0x22] = sVar28 + sVar24;
  coeff[0x23] = sVar44 + sVar41;
  coeff[0x24] = sVar45 + sVar42;
  coeff[0x25] = sVar20 + sVar16;
  coeff[0x26] = sVar36 + sVar32;
  coeff[0x27] = sVar46 + sVar43;
  coeff[0x28] = sVar8 - sVar14;
  coeff[0x29] = sVar56 - sVar60;
  coeff[0x2a] = sVar24 - sVar28;
  coeff[0x2b] = sVar41 - sVar44;
  coeff[0x2c] = sVar42 - sVar45;
  coeff[0x2d] = sVar16 - sVar20;
  coeff[0x2e] = sVar32 - sVar36;
  coeff[0x2f] = sVar43 - sVar46;
  coeff[0x30] = sVar9 - sVar66;
  coeff[0x31] = sVar10 - sVar67;
  coeff[0x32] = sVar12 - sVar68;
  coeff[0x33] = sVar13 - sVar69;
  coeff[0x34] = sVar15 - sVar70;
  coeff[0x35] = sVar17 - sVar63;
  coeff[0x36] = sVar19 - sVar71;
  coeff[0x37] = sVar21 - sVar94;
  coeff[0x38] = sVar66 + sVar9;
  coeff[0x39] = sVar67 + sVar10;
  coeff[0x3a] = sVar68 + sVar12;
  coeff[0x3b] = sVar69 + sVar13;
  coeff[0x3c] = sVar70 + sVar15;
  coeff[0x3d] = sVar63 + sVar17;
  coeff[0x3e] = sVar71 + sVar19;
  coeff[0x3f] = sVar94 + sVar21;
  return;
}

Assistant:

static inline void hadamard_lp_8x8_sse2(const int16_t *src_diff,
                                        ptrdiff_t src_stride, int16_t *coeff) {
  __m128i src[8];
  src[0] = _mm_load_si128((const __m128i *)src_diff);
  src[1] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[2] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[3] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[4] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[5] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[6] = _mm_load_si128((const __m128i *)(src_diff += src_stride));
  src[7] = _mm_load_si128((const __m128i *)(src_diff + src_stride));

  hadamard_col8_sse2(src, 0);
  hadamard_col8_sse2(src, 1);

  _mm_store_si128((__m128i *)coeff, src[0]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[1]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[2]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[3]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[4]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[5]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[6]);
  coeff += 8;
  _mm_store_si128((__m128i *)coeff, src[7]);
}